

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O0

void Dar_ManRefStop(Ref_Man_t *p)

{
  Ref_Man_t *p_local;
  
  if (p->pManDec != (Bdc_Man_t *)0x0) {
    Bdc_ManFree(p->pManDec);
  }
  if (p->pPars->fVerbose != 0) {
    Dar_ManRefPrintStats(p);
  }
  Vec_VecFree(p->vCuts);
  Vec_PtrFree(p->vTruthElem);
  Vec_PtrFree(p->vTruthStore);
  Vec_PtrFree(p->vLeavesBest);
  Vec_IntFree(p->vMemory);
  Vec_PtrFree(p->vCutNodes);
  if (p != (Ref_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Dar_ManRefStop( Ref_Man_t * p )
{
    if ( p->pManDec )
        Bdc_ManFree( p->pManDec );
    if ( p->pPars->fVerbose )
        Dar_ManRefPrintStats( p );
    Vec_VecFree( p->vCuts );
    Vec_PtrFree( p->vTruthElem );
    Vec_PtrFree( p->vTruthStore );
    Vec_PtrFree( p->vLeavesBest );
    Vec_IntFree( p->vMemory );
    Vec_PtrFree( p->vCutNodes );
    ABC_FREE( p );
}